

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O1

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateIndex
          (DuckSchemaEntry *this,CatalogTransaction transaction,CreateIndexInfo *info,
          TableCatalogEntry *table)

{
  OnCreateConflict on_conflict;
  Catalog *catalog;
  CatalogTransaction transaction_00;
  LogicalDependencyList *pLVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DuckIndexEntry *this_00;
  pointer pDVar4;
  optional_ptr<duckdb::CatalogEntry,_true> oVar5;
  CatalogException *this_01;
  long *plVar6;
  __buckets_ptr pp_Var7;
  templated_unique_single_t index;
  LogicalDependencyList dependencies;
  __alloc_node_gen_t __alloc_node_gen;
  _Head_base<0UL,_duckdb::DuckIndexEntry_*,_false> local_100;
  _Head_base<0UL,_duckdb::DuckIndexEntry_*,_false> local_f8;
  undefined1 local_f0 [32];
  _Prime_rehash_policy local_d0;
  __node_base_ptr local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  DatabaseInstance *local_98;
  ClientContext *pCStack_90;
  Transaction *local_88;
  transaction_t tStack_80;
  transaction_t local_78;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  LogicalDependencyList::AddDependency(&(info->super_CreateInfo).dependencies,(CatalogEntry *)table)
  ;
  if ((info->super_CreateInfo).on_conflict != IGNORE_ON_CONFLICT) {
    iVar3 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0x10])(table);
    bVar2 = DataTable::IndexNameIsUnique
                      ((DataTable *)CONCAT44(extraout_var,iVar3),&info->index_name);
    if (!bVar2) {
      this_01 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::operator+(&local_b8,"An index with the name ",&info->index_name);
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_b8);
      local_f0._0_8_ = *plVar6;
      pp_Var7 = (__buckets_ptr)(plVar6 + 2);
      if ((__buckets_ptr)local_f0._0_8_ == pp_Var7) {
        local_f0._16_8_ = *pp_Var7;
        local_f0._24_8_ = plVar6[3];
        local_f0._0_8_ = local_f0 + 0x10;
      }
      else {
        local_f0._16_8_ = *pp_Var7;
      }
      local_f0._8_8_ = plVar6[1];
      *plVar6 = (long)pp_Var7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      CatalogException::CatalogException(this_01,(string *)local_f0);
      __cxa_throw(this_01,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  catalog = (this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog;
  this_00 = (DuckIndexEntry *)operator_new(0x200);
  DuckIndexEntry::DuckIndexEntry(this_00,catalog,&this->super_SchemaCatalogEntry,info,table);
  local_f8._M_head_impl = this_00;
  pDVar4 = unique_ptr<duckdb::DuckIndexEntry,_std::default_delete<duckdb::DuckIndexEntry>,_true>::
           operator->((unique_ptr<duckdb::DuckIndexEntry,_std::default_delete<duckdb::DuckIndexEntry>,_true>
                       *)&local_f8);
  local_b8._M_dataplus._M_p = local_f0;
  local_f0._0_8_ = (__buckets_ptr)0x0;
  local_f0._8_8_ =
       (pDVar4->super_IndexCatalogEntry).super_StandardEntry.dependencies.set._M_h._M_bucket_count;
  local_f0._16_8_ = (_Hash_node_base *)0x0;
  local_f0._24_8_ =
       (pDVar4->super_IndexCatalogEntry).super_StandardEntry.dependencies.set._M_h._M_element_count;
  pLVar1 = &(pDVar4->super_IndexCatalogEntry).super_StandardEntry.dependencies;
  local_d0._M_max_load_factor = (pLVar1->set)._M_h._M_rehash_policy._M_max_load_factor;
  local_d0._4_4_ = *(undefined4 *)&(pLVar1->set)._M_h._M_rehash_policy.field_0x4;
  local_d0._M_next_resize =
       (pDVar4->super_IndexCatalogEntry).super_StandardEntry.dependencies.set._M_h._M_rehash_policy.
       _M_next_resize;
  local_c0 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,true>>>>
            ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_b8._M_dataplus._M_p,
             (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&(pDVar4->super_IndexCatalogEntry).super_StandardEntry.dependencies,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,_true>_>_>
              *)&local_b8);
  local_100._M_head_impl = local_f8._M_head_impl;
  local_98 = transaction.db.ptr;
  pCStack_90 = transaction.context.ptr;
  local_88 = transaction.transaction.ptr;
  tStack_80 = transaction.transaction_id;
  local_78 = transaction.start_time;
  local_f8._M_head_impl = (DuckIndexEntry *)0x0;
  on_conflict = (info->super_CreateInfo).on_conflict;
  local_b8._M_dataplus._M_p = (pointer)&local_68;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = local_f0._8_8_;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = local_f0._24_8_;
  local_68._M_rehash_policy._M_max_load_factor = local_d0._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ = local_d0._4_4_;
  local_68._M_rehash_policy._M_next_resize = local_d0._M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,true>>>>
            ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_b8._M_dataplus._M_p,
             (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_f0,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,_true>_>_>
              *)&local_b8);
  transaction_00.context.ptr = pCStack_90;
  transaction_00.db.ptr = local_98;
  transaction_00.transaction.ptr = local_88;
  transaction_00.transaction_id = tStack_80;
  transaction_00.start_time = local_78;
  oVar5 = AddEntryInternal(this,transaction_00,
                           (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                            *)&local_100,on_conflict,(LogicalDependencyList *)&local_68);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_100._M_head_impl != (DuckIndexEntry *)0x0) {
    (*((local_100._M_head_impl)->super_IndexCatalogEntry).super_StandardEntry.super_InCatalogEntry.
      super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_100._M_head_impl = (DuckIndexEntry *)0x0;
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_f0);
  if (local_f8._M_head_impl != (DuckIndexEntry *)0x0) {
    (*((local_f8._M_head_impl)->super_IndexCatalogEntry).super_StandardEntry.super_InCatalogEntry.
      super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar5.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateIndex(CatalogTransaction transaction, CreateIndexInfo &info,
                                                        TableCatalogEntry &table) {
	info.dependencies.AddDependency(table);

	// currently, we can not alter PK/FK/UNIQUE constraints
	// concurrency-safe name checks against other INDEX catalog entries happens in the catalog
	if (info.on_conflict != OnCreateConflict::IGNORE_ON_CONFLICT &&
	    !table.GetStorage().IndexNameIsUnique(info.index_name)) {
		throw CatalogException("An index with the name " + info.index_name + " already exists!");
	}

	auto index = make_uniq<DuckIndexEntry>(catalog, *this, info, table);
	auto dependencies = index->dependencies;
	return AddEntryInternal(transaction, std::move(index), info.on_conflict, dependencies);
}